

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arc.cpp
# Opt level: O1

bool __thiscall ON_Arc::Create(ON_Arc *this,ON_Circle *circle,ON_Interval angle_interval_in_radians)

{
  ON_Interval *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  ON_Circle *pOVar5;
  ON_Arc *pOVar6;
  double dVar7;
  
  pOVar5 = circle;
  pOVar6 = this;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pOVar6->super_ON_Circle).plane.origin.x = (pOVar5->plane).origin.x;
    pOVar5 = (ON_Circle *)&(pOVar5->plane).origin.y;
    pOVar6 = (ON_Arc *)&(pOVar6->super_ON_Circle).plane.origin.y;
  }
  ON_Plane::UpdateEquation((ON_Plane *)this);
  (this->super_ON_Circle).radius = circle->radius;
  this_00 = &this->m_angle;
  (this->m_angle).m_t[0] = angle_interval_in_radians.m_t[0];
  (this->m_angle).m_t[1] = angle_interval_in_radians.m_t[1];
  bVar2 = ON_Interval::IsDecreasing(this_00);
  bVar2 = !bVar2;
  if (!bVar2) {
    ON_Interval::Swap(this_00);
    Reverse(this);
  }
  dVar7 = ON_Interval::Length(this_00);
  bVar1 = dVar7 <= 6.283185307179586;
  if (!bVar1) {
    (this->m_angle).m_t[1] = (this->m_angle).m_t[0] + 6.283185307179586;
  }
  bVar3 = bVar1 && bVar2;
  if (bVar1 && bVar2) {
    bVar3 = IsValid(this);
  }
  return bVar3;
}

Assistant:

bool ON_Arc::Create(
  const ON_Circle& circle,
  ON_Interval angle_interval_in_radians
  )
{
  bool rc = true;
  plane = circle.plane;
  plane.UpdateEquation();
  radius = circle.radius;
  m_angle = angle_interval_in_radians;
  if ( m_angle.IsDecreasing() )
  {
    rc = false; // bogus input
    // m_angle must never be decreasing
    m_angle.Swap();
    Reverse();
  }
  if ( m_angle.Length() > 2.0*ON_PI )
  {
    rc = false; // bogus input
    m_angle.m_t[1] = m_angle.m_t[0] + 2.0*ON_PI;
  }
  if ( rc )
    rc = IsValid();
  return rc;
}